

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  undefined1 *puVar1;
  Curl_easy *data;
  _Bool _Var2;
  sa_family_t sVar3;
  CURLcode CVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  if2ip_result_t iVar8;
  undefined8 extraout_RAX;
  size_t sVar9;
  long lVar10;
  uint *puVar11;
  int *piVar12;
  CURLcode __len;
  ushort uVar13;
  char *pcVar14;
  char *fmt;
  Curl_easy *pCVar15;
  char cVar16;
  bool bVar17;
  curltime cVar18;
  curl_socket_t sockfd;
  Curl_dns_entry *h;
  int optval;
  long port;
  curl_socklen_t size;
  curl_socklen_t onoff;
  char ipaddress [46];
  char buffer [128];
  Curl_sockaddr_ex addr;
  char buffer_1 [128];
  uint local_34c;
  Curl_easy *local_348;
  char *local_340;
  uint local_334;
  uint local_330;
  int local_32c;
  char *local_328;
  Curl_dns_entry *local_320;
  long local_318;
  undefined4 local_310;
  undefined4 local_30c;
  long local_308;
  socklen_t local_2fc;
  sockaddr local_2f8;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  char local_278 [48];
  sockaddr local_248;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_148 [144];
  char local_b8 [136];
  
  data = conn->data;
  local_30c = 1;
  *sockp = -1;
  CVar4 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)local_148,(curl_socket_t *)&local_34c);
  if (CVar4 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var2 = getaddressinfo((sockaddr *)(local_148 + 0x10),local_278,&local_308);
  if (!_Var2) {
    puVar11 = (uint *)__errno_location();
    uVar7 = *puVar11;
    pcVar14 = Curl_strerror(uVar7,(char *)&local_248,0x80);
    Curl_failf(data,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar7,pcVar14);
    Curl_closesocket(conn,local_34c);
    return CURLE_OK;
  }
  iVar6 = 0;
  Curl_infof(data,"  Trying %s:%ld...\n",local_278,local_308);
  if (((local_148._0_4_ & 0xfffffff7) == 2) && (local_148._4_4_ == 1)) {
    if (((data->set).field_0x87c & 8) != 0) {
      pCVar15 = conn->data;
      local_2f8._0_4_ = 1;
      iVar5 = setsockopt(local_34c,6,1,&local_2f8,4);
      if (iVar5 < 0) {
        piVar12 = __errno_location();
        pcVar14 = Curl_strerror(*piVar12,(char *)&local_248,0x80);
        Curl_infof(pCVar15,"Could not set TCP_NODELAY: %s\n",pcVar14);
      }
      else {
        Curl_infof(pCVar15,"TCP_NODELAY set\n");
      }
    }
    uVar7 = local_34c;
    if (((data->set).field_0x87d & 8) != 0) {
      local_248._0_4_ = 1;
      iVar5 = setsockopt(local_34c,1,9,&local_248,4);
      if (iVar5 < 0) {
        pcVar14 = "Failed to set SO_KEEPALIVE on fd %d\n";
      }
      else {
        iVar5 = curlx_sltosi((data->set).tcp_keepidle);
        local_248._0_4_ = iVar5;
        iVar5 = setsockopt(uVar7,6,4,&local_248,4);
        if (iVar5 < 0) {
          Curl_infof(data,"Failed to set TCP_KEEPIDLE on fd %d\n",(ulong)uVar7);
        }
        iVar5 = curlx_sltosi((data->set).tcp_keepintvl);
        local_248._0_4_ = iVar5;
        iVar5 = setsockopt(uVar7,6,5,&local_248,4);
        if (-1 < iVar5) goto LAB_0047bbc8;
        pcVar14 = "Failed to set TCP_KEEPINTVL on fd %d\n";
      }
      Curl_infof(data,pcVar14,(ulong)uVar7);
    }
  }
LAB_0047bbc8:
  if ((data->set).fsockopt == (curl_sockopt_callback)0x0) {
LAB_0047bc24:
    local_310 = 0;
  }
  else {
    Curl_set_in_callback(data,true);
    uVar7 = local_34c;
    iVar6 = (*(data->set).fsockopt)((data->set).sockopt_client,local_34c,CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data,false);
    if (iVar6 == 0) goto LAB_0047bc24;
    local_310 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    if (iVar6 != 2) {
      Curl_closesocket(conn,uVar7);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  local_32c = iVar6;
  if ((local_148._0_4_ & 0xfffffff7) != 2) goto LAB_0047c1cc;
  local_340 = (char *)CONCAT44(local_340._4_4_,local_148._0_4_);
  local_334 = local_34c;
  uVar7 = Curl_ipv6_scope((sockaddr *)(local_148 + 0x10));
  pCVar15 = conn->data;
  local_320 = (Curl_dns_entry *)0x0;
  uVar13 = (pCVar15->set).localport;
  pcVar14 = (pCVar15->set).str[8];
  CVar4 = CURLE_OK;
  if (uVar13 != 0 || pcVar14 != (char *)0x0) {
    local_318 = CONCAT44(local_318._4_4_,uVar7);
    iVar6 = (pCVar15->set).localportrange;
    local_288 = 0;
    uStack_280 = 0;
    local_298 = 0;
    uStack_290 = 0;
    local_2a8 = 0;
    uStack_2a0 = 0;
    local_2b8 = 0;
    uStack_2b0 = 0;
    local_2c8 = 0;
    uStack_2c0 = 0;
    local_2d8 = 0;
    uStack_2d0 = 0;
    local_2e8 = 0;
    uStack_2e0 = 0;
    local_2f8.sa_family = 0;
    local_2f8.sa_data[0] = '\0';
    local_2f8.sa_data[1] = '\0';
    local_2f8.sa_data[2] = '\0';
    local_2f8.sa_data[3] = '\0';
    local_2f8.sa_data[4] = '\0';
    local_2f8.sa_data[5] = '\0';
    local_2f8.sa_data[6] = '\0';
    local_2f8.sa_data[7] = '\0';
    local_2f8.sa_data[8] = '\0';
    local_2f8.sa_data[9] = '\0';
    local_2f8.sa_data[10] = '\0';
    local_2f8.sa_data[0xb] = '\0';
    local_2f8.sa_data[0xc] = '\0';
    local_2f8.sa_data[0xd] = '\0';
    local_348 = pCVar15;
    if ((pcVar14 == (char *)0x0) || (sVar9 = strlen(pcVar14), 0xfe < sVar9)) {
      if ((CURLcode)local_340 == 10) {
        __len = CURLE_OPERATION_TIMEDOUT;
        sVar3 = 10;
      }
      else {
        __len = CURLE_OK;
        if ((CURLcode)local_340 != 2) goto LAB_0047c080;
        __len = CURLE_HTTP2;
        sVar3 = 2;
      }
      local_2f8.sa_data._0_2_ = uVar13 << 8 | uVar13 >> 8;
      local_2f8.sa_family = sVar3;
    }
    else {
      memset(&local_248,0,0x100);
      iVar5 = strncmp("if!",pcVar14,3);
      cVar16 = iVar5 == 0;
      if ((bool)cVar16) {
        bVar17 = false;
        lVar10 = 3;
      }
      else {
        iVar5 = strncmp("host!",pcVar14,5);
        bVar17 = iVar5 == 0;
        lVar10 = (ulong)bVar17 * 5;
      }
      pcVar14 = pcVar14 + lVar10;
      local_328 = pcVar14;
      if (bVar17) {
        CVar4 = CURLE_OK;
LAB_0047bd93:
        pcVar14 = local_328;
        if (cVar16 == '\0') {
          local_318 = conn->ip_version;
          if ((CURLcode)local_340 == 2) {
            lVar10 = 1;
LAB_0047be7a:
            conn->ip_version = lVar10;
          }
          else if ((CURLcode)local_340 == 10) {
            lVar10 = 2;
            goto LAB_0047be7a;
          }
          Curl_resolv(conn,local_328,0,false,&local_320);
          conn->ip_version = local_318;
          if (local_320 == (Curl_dns_entry *)0x0) {
            CVar4 = ~CURLE_OK;
          }
          else {
            Curl_printable_address(local_320->addr,(char *)&local_248,0x100);
            Curl_infof(local_348,"Name \'%s\' family %i resolved to \'%s\' family %i\n",pcVar14,
                       (ulong)local_340 & 0xffffffff,&local_248,
                       (ulong)(uint)local_320->addr->ai_family);
            Curl_resolv_unlock(local_348,local_320);
            CVar4 = CURLE_UNSUPPORTED_PROTOCOL;
          }
        }
        __len = CURLE_OK;
        if (0 < (int)CVar4) {
          if ((CURLcode)local_340 == 2) {
            iVar5 = inet_pton(2,(char *)&local_248,local_2f8.sa_data + 2);
            __len = CURLE_OK;
            if (0 < iVar5) {
              local_2f8.sa_data._0_2_ = uVar13 << 8 | uVar13 >> 8;
              local_2f8.sa_family = 2;
              __len = CURLE_HTTP2;
            }
          }
          else if ((CURLcode)local_340 == 10) {
            pcVar14 = strchr((char *)&local_248,0x25);
            if (pcVar14 == (char *)0x0) {
              local_340 = (char *)0x0;
            }
            else {
              local_340 = pcVar14 + 1;
              *pcVar14 = '\0';
            }
            iVar5 = inet_pton(10,(char *)&local_248,local_2f8.sa_data + 6);
            __len = CURLE_OPERATION_TIMEDOUT;
            if (0 < iVar5) {
              local_2f8.sa_data._0_2_ = uVar13 << 8 | uVar13 >> 8;
              local_2f8.sa_family = 10;
              if (local_340 != (char *)0x0) {
                iVar5 = atoi(local_340);
                __len = CURLE_OPERATION_TIMEDOUT;
                uStack_2e0 = CONCAT44(uStack_2e0._4_4_,iVar5);
              }
            }
          }
        }
        if ((int)CVar4 < 1) {
          local_340 = (char *)CONCAT44(local_340._4_4_,__len);
          puVar1 = &(local_348->state).field_0x4e4;
          *puVar1 = *puVar1 & 0xf7;
          pcVar14 = "Couldn\'t bind to \'%s\'";
LAB_0047c054:
          Curl_failf(local_348,pcVar14,local_328);
          bVar17 = false;
          CVar4 = CURLE_INTERFACE_FAILED;
          __len = (CURLcode)local_340;
        }
        else {
          bVar17 = true;
        }
      }
      else {
        local_330 = (uint)(byte)cVar16;
        sVar9 = strlen(pcVar14);
        iVar5 = setsockopt(local_334,1,0x19,pcVar14,(int)sVar9 + 1);
        if (iVar5 != 0) {
          iVar8 = Curl_if2ip((CURLcode)local_340,(uint)local_318,conn->scope_id,pcVar14,
                             (char *)&local_248,0x100);
          if (iVar8 == IF2IP_FOUND) {
            Curl_infof(local_348,"Local Interface %s is ip %s using address family %i\n",local_328,
                       &local_248,(ulong)local_340 & 0xffffffff);
            cVar16 = '\x01';
            CVar4 = CURLE_UNSUPPORTED_PROTOCOL;
            goto LAB_0047bd93;
          }
          __len = CURLE_OK;
          if (iVar8 == IF2IP_AF_NOT_SUPPORTED) {
            bVar17 = false;
            CVar4 = CURLE_UNSUPPORTED_PROTOCOL;
            goto LAB_0047c06c;
          }
          cVar16 = (char)local_330;
          CVar4 = __len;
          if ((iVar8 != IF2IP_NOT_FOUND) || (CVar4 = CURLE_OK, cVar16 == '\0')) goto LAB_0047bd93;
          local_340 = (char *)((ulong)local_340 & 0xffffffff00000000);
          pcVar14 = "Couldn\'t bind to interface \'%s\'";
          goto LAB_0047c054;
        }
        bVar17 = false;
        __len = CURLE_OK;
        CVar4 = CURLE_OK;
      }
LAB_0047c06c:
      if (!bVar17) goto LAB_0047c1a0;
    }
LAB_0047c080:
    while (iVar5 = bind(local_334,&local_2f8,__len), iVar5 < 0) {
      if (iVar6 < 2) {
        puVar11 = (uint *)__errno_location();
        pCVar15 = local_348;
        uVar7 = *puVar11;
        (local_348->state).os_errno = uVar7;
        pcVar14 = Curl_strerror(uVar7,(char *)&local_248,0x80);
        fmt = "bind failed with errno %d: %s";
        goto LAB_0047c18b;
      }
      iVar6 = iVar6 + -1;
      Curl_infof(local_348,"Bind to local port %hu failed, trying next\n",(ulong)uVar13);
      uVar13 = uVar13 + 1;
      local_2f8.sa_data._0_2_ = uVar13 * 0x100 | uVar13 >> 8;
    }
    local_2fc = 0x80;
    local_248.sa_family = 0;
    local_248.sa_data[0] = '\0';
    local_248.sa_data[1] = '\0';
    local_248.sa_data[2] = '\0';
    local_248.sa_data[3] = '\0';
    local_248.sa_data[4] = '\0';
    local_248.sa_data[5] = '\0';
    local_248.sa_data[6] = '\0';
    local_248.sa_data[7] = '\0';
    local_248.sa_data[8] = '\0';
    local_248.sa_data[9] = '\0';
    local_248.sa_data[10] = '\0';
    local_248.sa_data[0xb] = '\0';
    local_248.sa_data[0xc] = '\0';
    local_248.sa_data[0xd] = '\0';
    local_238 = 0;
    uStack_230 = 0;
    local_228 = 0;
    uStack_220 = 0;
    local_218 = 0;
    uStack_210 = 0;
    local_208 = 0;
    uStack_200 = 0;
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_1e8 = 0;
    uStack_1e0 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0;
    iVar6 = getsockname(local_334,&local_248,&local_2fc);
    if (iVar6 < 0) {
      puVar11 = (uint *)__errno_location();
      pCVar15 = local_348;
      uVar7 = *puVar11;
      (local_348->state).os_errno = uVar7;
      pcVar14 = Curl_strerror(uVar7,local_b8,0x80);
      fmt = "getsockname() failed with errno %d: %s";
LAB_0047c18b:
      Curl_failf(pCVar15,fmt,(ulong)uVar7,pcVar14);
      CVar4 = CURLE_INTERFACE_FAILED;
    }
    else {
      CVar4 = CURLE_OK;
      Curl_infof(local_348,"Local port: %hu\n",(ulong)uVar13);
      puVar1 = &(conn->bits).field_0x7;
      *puVar1 = *puVar1 | 1;
    }
  }
LAB_0047c1a0:
  if (CVar4 != CURLE_OK) {
    Curl_closesocket(conn,local_34c);
    if (CVar4 == CURLE_UNSUPPORTED_PROTOCOL) {
      return CURLE_COULDNT_CONNECT;
    }
    return CVar4;
  }
LAB_0047c1cc:
  curlx_nonblock(local_34c,1);
  cVar18 = Curl_now();
  (conn->connecttime).tv_sec = cVar18.tv_sec;
  (conn->connecttime).tv_usec = cVar18.tv_usec;
  if (1 < conn->num_addr) {
    Curl_expire(data,conn->timeoutms_per_addr,EXPIRE_DNS_PER_NAME);
  }
  if (((char)local_310 == '\0') && (conn->socktype == 1)) {
    if (((conn->bits).field_0x7 & 8) != 0) {
      iVar6 = setsockopt(local_34c,6,0x1e,&local_30c,4);
      if (iVar6 < 0) {
        Curl_infof(data,"Failed to enable TCP Fast Open on fd %d\n",(ulong)local_34c);
      }
      else {
        Curl_infof(data,"TCP_FASTOPEN_CONNECT set\n");
      }
    }
    iVar6 = connect(local_34c,(sockaddr *)(local_148 + 0x10),local_148._12_4_);
    if (iVar6 == -1) {
      piVar12 = __errno_location();
      local_32c = *piVar12;
    }
    iVar5 = local_32c;
    CVar4 = CURLE_OK;
    bVar17 = true;
    if (((iVar6 == -1) && (local_32c != 0xb)) && (local_32c != 0x73)) {
      pcVar14 = Curl_strerror(local_32c,(char *)&local_248,0x80);
      Curl_infof(data,"Immediate connect fail for %s: %s\n",local_278,pcVar14);
      (data->state).os_errno = iVar5;
      Curl_closesocket(conn,local_34c);
      bVar17 = false;
      CVar4 = CURLE_COULDNT_CONNECT;
    }
    if (bVar17) {
      *sockp = local_34c;
    }
  }
  else {
    *sockp = local_34c;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode singleipconnect(struct connectdata *conn,
                                const Curl_addrinfo *ai,
                                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc = -1;
  int error = 0;
  bool isconnected = FALSE;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  long port;
  bool is_tcp;
#ifdef TCP_FASTOPEN_CONNECT
  int optval = 1;
#endif
  char buffer[STRERROR_LEN];

  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(conn, ai, &addr, &sockfd);
  if(result)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!getaddressinfo((struct sockaddr*)&addr.sa_addr,
                     ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(errno, buffer, sizeof(buffer)));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s:%ld...\n", ipaddress, port);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(conn, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_now();
  if(conn->num_addr > 1)
    Curl_expire(data, conn->timeoutms_per_addr, EXPIRE_DNS_PER_NAME);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    if(conn->bits.tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* Darwin */
#  if defined(HAVE_BUILTIN_AVAILABLE)
      /* while connectx function is available since macOS 10.11 / iOS 9,
         it did not have the interface declared correctly until
         Xcode 9 / macOS SDK 10.13 */
      if(__builtin_available(macOS 10.11, iOS 9.0, tvOS 9.0, watchOS 2.0, *)) {
        sa_endpoints_t endpoints;
        endpoints.sae_srcif = 0;
        endpoints.sae_srcaddr = NULL;
        endpoints.sae_srcaddrlen = 0;
        endpoints.sae_dstaddr = &addr.sa_addr;
        endpoints.sae_dstaddrlen = addr.addrlen;

        rc = connectx(sockfd, &endpoints, SAE_ASSOCID_ANY,
                      CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                      NULL, 0, NULL, NULL);
      }
      else {
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      }
#  else
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#  endif /* HAVE_BUILTIN_AVAILABLE */
#elif defined(TCP_FASTOPEN_CONNECT) /* Linux >= 4.11 */
      if(setsockopt(sockfd, IPPROTO_TCP, TCP_FASTOPEN_CONNECT,
                    (void *)&optval, sizeof(optval)) < 0)
        infof(data, "Failed to enable TCP Fast Open on fd %d\n", sockfd);
      else
        infof(data, "TCP_FASTOPEN_CONNECT set\n");

      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#elif defined(MSG_FASTOPEN) /* old Linux */
      if(conn->given->flags & PROTOPT_SSL)
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      else
        rc = 0; /* Do nothing */
#endif
    }
    else {
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    }

    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(error, buffer, sizeof(buffer)));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}